

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoMesh::FindCloseElement
          (TPZGeoMesh *this,TPZVec<double> *x,int64_t *InitialElIndex,int targetDim)

{
  int64_t iVar1;
  TPZGeoEl *pTVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  TPZGeoNode *this_00;
  mapped_type_conflict4 *pmVar5;
  long lVar6;
  int ic;
  int iVar7;
  TPZGeoEl *this_01;
  TPZGeoEl *pTVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  TPZGeoElSide neighbour;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> distneigh;
  REAL distcenter;
  TPZManVector<double,_3> xcorner;
  TPZGeoElSide centerneigh;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> cornerdist;
  TPZManVector<double,_3> xcenter;
  TPZManVector<TPZManVector<double,_3>,_8> cornercenter;
  undefined1 local_320 [8];
  TPZGeoEl *local_318;
  int local_310;
  undefined1 local_308 [8];
  _Rb_tree_node_base local_300;
  size_t local_2e0;
  TPZChunkVector<TPZGeoEl_*,_10> *local_2d8;
  double local_2d0;
  TPZManVector<double,_3> local_2c8;
  TPZGeoElSide local_290;
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  local_278;
  TPZManVector<double,_3> local_248;
  TPZManVector<TPZManVector<double,_3>,_8> local_210;
  
  TPZManVector<double,_3>::TPZManVector(&local_248,3);
  TPZManVector<TPZManVector<double,_3>,_8>::TPZManVector(&local_210,0);
  if ((this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements <= *InitialElIndex) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgmesh.cpp",
               0x1df);
  }
  local_2d8 = &(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
  ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_2d8,*InitialElIndex);
  if (*ppTVar4 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgmesh.cpp",
               0x1e4);
  }
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar8 = *ppTVar4;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    this_01 = pTVar8;
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::clear(&local_278);
    for (iVar7 = 0; iVar3 = (**(code **)(*(long *)this_01 + 0x98))(this_01), iVar7 < iVar3;
        iVar7 = iVar7 + 1) {
      TPZManVector<double,_3>::TPZManVector(&local_2c8,3);
      this_00 = TPZGeoEl::NodePtr(this_01,iVar7);
      TPZGeoNode::GetCoordinates(this_00,&local_2c8.super_TPZVec<double>);
      local_308 = (undefined1  [8])0x0;
      lVar6 = 0;
      do {
        dVar9 = x->fStore[lVar6] - (double)((long *)local_2c8.super_TPZVec<double>.fStore)[lVar6];
        local_308 = (undefined1  [8])((double)local_308 + dVar9 * dVar9);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      if ((double)local_308 < 0.0) {
        local_308 = (undefined1  [8])sqrt((double)local_308);
      }
      else {
        local_308 = (undefined1  [8])SQRT((double)local_308);
      }
      pmVar5 = std::
               map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
               operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                           *)&local_278,(key_type_conflict *)local_308);
      *pmVar5 = iVar7;
      TPZManVector<double,_3>::~TPZManVector(&local_2c8);
    }
    TPZManVector<double,_3>::TPZManVector(&local_2c8,3);
    iVar7 = (**(code **)(*(long *)this_01 + 0xf0))(this_01);
    local_308 = (undefined1  [8])&PTR__TPZGeoElSide_018f8760;
    local_300._M_parent = (_Base_ptr)CONCAT44(local_300._M_parent._4_4_,iVar7 + -1);
    local_300._0_8_ = this_01;
    TPZGeoElSide::CenterX((TPZGeoElSide *)local_308,&local_2c8.super_TPZVec<double>);
    if (x->fNElements < 1) {
      dVar9 = 0.0;
    }
    else {
      dVar9 = 0.0;
      lVar6 = 0;
      do {
        dVar10 = x->fStore[lVar6] - (double)((long *)local_2c8.super_TPZVec<double>.fStore)[lVar6];
        dVar9 = dVar9 + dVar10 * dVar10;
        lVar6 = lVar6 + 1;
      } while (x->fNElements != lVar6);
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    TPZManVector<double,_3>::~TPZManVector(&local_2c8);
    if ((dVar9 < *(double *)(local_278._M_impl.super__Rb_tree_header._M_header._M_left + 1)) ||
       (*(double *)(local_278._M_impl.super__Rb_tree_header._M_header._M_left + 1) < 1e-15)) break;
    iVar7 = *(int *)&local_278._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
    (**(code **)(*(long *)this_01 + 0x188))(local_320,this_01,iVar7);
    local_300._0_8_ = local_300._0_8_ & 0xffffffff00000000;
    local_300._M_parent = (_Base_ptr)0x0;
    local_300._M_left = &local_300;
    local_2e0 = 0;
    local_300._M_right = local_300._M_left;
    pTVar8 = this_01;
    dVar10 = dVar9;
    if ((local_318 != this_01) || (local_310 != iVar7)) {
      do {
        iVar3 = (**(code **)(*(long *)local_318 + 0x210))();
        if (iVar3 == targetDim) {
          TPZManVector<double,_3>::TPZManVector(&local_2c8,3);
          pTVar2 = local_318;
          local_290.fSide = (**(code **)(*(long *)local_318 + 0xf0))(local_318);
          local_290.fSide = local_290.fSide + -1;
          local_290.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_290.fGeoEl = pTVar2;
          TPZGeoElSide::CenterX(&local_290,&local_2c8.super_TPZVec<double>);
          if (CONCAT44(local_2c8.super_TPZVec<double>.fNElements._4_4_,
                       (int)local_2c8.super_TPZVec<double>.fNElements) < 1) {
            __x = 0.0;
          }
          else {
            __x = 0.0;
            lVar6 = 0;
            do {
              dVar11 = (double)((long *)local_2c8.super_TPZVec<double>.fStore)[lVar6] -
                       x->fStore[lVar6];
              __x = __x + dVar11 * dVar11;
              lVar6 = lVar6 + 1;
            } while (CONCAT44(local_2c8.super_TPZVec<double>.fNElements._4_4_,
                              (int)local_2c8.super_TPZVec<double>.fNElements) != lVar6);
          }
          if (__x < 0.0) {
            local_2d0 = sqrt(__x);
          }
          else {
            local_2d0 = SQRT(__x);
          }
          iVar1 = local_318->fIndex;
          pmVar5 = std::
                   map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                 *)local_308,&local_2d0);
          *pmVar5 = (mapped_type_conflict4)iVar1;
          TPZManVector<double,_3>::~TPZManVector(&local_2c8);
        }
        if (local_318 == (TPZGeoEl *)0x0) {
          local_2c8.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_2c8.super_TPZVec<double>.fStore = (double *)0x0;
          local_2c8.super_TPZVec<double>.fNElements._0_4_ = -1;
        }
        else {
          (**(code **)(*(long *)local_318 + 0x188))(&local_2c8,local_318,local_310);
        }
        local_310 = (int)local_2c8.super_TPZVec<double>.fNElements;
        local_318 = (TPZGeoEl *)local_2c8.super_TPZVec<double>.fStore;
      } while (((TPZGeoEl *)local_2c8.super_TPZVec<double>.fStore != this_01) ||
              ((int)local_2c8.super_TPZVec<double>.fNElements != iVar7));
      if (local_2e0 != 0) {
        ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (local_2d8,(long)*(int *)&local_300._M_left[1]._M_parent);
        pTVar8 = *ppTVar4;
        dVar10 = *(double *)(local_300._M_left + 1);
      }
    }
    if (dVar9 <= dVar10) {
      *InitialElIndex = this_01->fIndex;
      std::
      _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
      ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   *)local_308);
      goto LAB_010fc997;
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 *)local_308);
  } while (this_01 != pTVar8);
  *InitialElIndex = this_01->fIndex;
LAB_010fc997:
  std::
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  ::~_Rb_tree(&local_278);
  TPZManVector<TPZManVector<double,_3>,_8>::~TPZManVector(&local_210);
  TPZManVector<double,_3>::~TPZManVector(&local_248);
  return this_01;
}

Assistant:

TPZGeoEl * TPZGeoMesh::FindCloseElement(TPZVec<REAL> &x, int64_t & InitialElIndex, int targetDim) const
{
    // this method will not work if targetDim == 0 because it navigates through elements of dimension targetDim
    TPZManVector<REAL,3> xcenter(3);
    TPZManVector<TPZManVector<REAL, 3>, 8> cornercenter;
    // what happens if gelnext == 0 or if InitialIndex is out of scope??
    if (InitialElIndex >= fElementVec.NElements()) {
        DebugStop();
    }
    TPZGeoEl *gelnext = ElementVec()[InitialElIndex];
    
    if (gelnext == 0) {
        DebugStop();
    }
    
    TPZGeoEl *gel = 0;
    REAL geldist;
    std::map<REAL,int> cornerdist;
    while (gel != gelnext) {
        gel = gelnext;
        gelnext = 0;
        cornerdist.clear();
        // compute the corner coordinates
        for (int ic=0; ic<gel->NCornerNodes(); ic++) {
            TPZManVector<REAL,3> xcorner(3);
            gel->NodePtr(ic)->GetCoordinates(xcorner);
            REAL dist = 0.;
            for (int i=0; i<3; i++) {
                dist += (x[i]-xcorner[i])*(x[i]-xcorner[i]);
            }
            dist = sqrt(dist);
            cornerdist[dist]=ic;
        }
        // compute the distance of the center of the element
        {
            geldist = 0.;
            TPZManVector<REAL,3> xcenter(3);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            gelside.CenterX(xcenter);
            geldist = dist(x,xcenter);
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "FindClosestElement Tried element index " << gel->Index() << std::endl;
            sout << "Distance from the center " << geldist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // find the closest corner node
        REAL closestcorner = cornerdist.begin()->first;
        // if the center node is closer than the cornernode, return the element
        if (geldist < closestcorner || closestcorner < 1.e-15) {
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Distance from the closest corner " << closestcorner << "bailing out " << std::endl;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            InitialElIndex = gel->Index();
            return gel;
        }
        // look for all neighbours of the corner side
        TPZGeoElSide gelside(gel,cornerdist.begin()->second);
        TPZGeoElSide neighbour = gelside.Neighbour();
        std::map<REAL,int> distneigh;
        while (neighbour != gelside)
        {
            if (neighbour.Element()->Dimension() == targetDim)
            {
                TPZManVector<REAL,3> center(3);
                TPZGeoElSide centerneigh(neighbour.Element(),neighbour.Element()->NSides()-1);
                centerneigh.CenterX(center);
                REAL distcenter = dist(center,x);
                distneigh[distcenter] = neighbour.Element()->Index();
            }
            neighbour = neighbour.Neighbour();
        }
        // choose the element whose center is closest to the coordinate
        REAL gelnextdist = 0.;
        if (distneigh.size() == 0) {
            gelnext = gel;
            gelnextdist = geldist;
        }
        else {
            gelnext = ElementVec()[distneigh.begin()->second];
            gelnextdist = distneigh.begin()->first;
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Closest element index " << gelnext->Index() << std::endl;
            sout << "Distance from the center " << gelnextdist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // return if its center distance is larger than the distance of the current element
        if (geldist <= gelnextdist) {
            InitialElIndex = gel->Index();
            return gel;
        }
    }
    InitialElIndex = gel->Index();
    return gel;
}